

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::erase(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *this,size_type idx)

{
  vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  *this_00;
  pointer pbVar1;
  type_error *__return_storage_ptr__;
  out_of_range *__return_storage_ptr___00;
  long *plVar2;
  size_t sVar3;
  size_type *psVar4;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if (this->m_type != array) {
    __return_storage_ptr__ = (type_error *)__cxa_allocate_exception(0x20);
    if ((ulong)this->m_type < 9) {
      __s = (&PTR_anon_var_dwarf_fc02_00121d60)[this->m_type];
    }
    else {
      __s = "number";
    }
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s,__s + sVar3);
    std::operator+(&local_60,"cannot use erase() with ",&local_80);
    detail::type_error::create(__return_storage_ptr__,0x133,&local_60);
    __cxa_throw(__return_storage_ptr__,&detail::type_error::typeinfo,detail::exception::~exception);
  }
  this_00 = (this->m_value).array;
  pbVar1 = (this_00->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (idx < (ulong)((long)(this_00->
                          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 4)) {
    std::
    vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    ::_M_erase(this_00,pbVar1 + idx);
    return;
  }
  __return_storage_ptr___00 = (out_of_range *)__cxa_allocate_exception(0x20);
  std::__cxx11::to_string(&local_40,idx);
  std::operator+(&local_80,"array index ",&local_40);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
  local_60._M_dataplus._M_p = (pointer)*plVar2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_60._M_dataplus._M_p == psVar4) {
    local_60.field_2._M_allocated_capacity = *psVar4;
    local_60.field_2._8_8_ = plVar2[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar4;
  }
  local_60._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  detail::out_of_range::create(__return_storage_ptr___00,0x191,&local_60);
  __cxa_throw(__return_storage_ptr___00,&detail::out_of_range::typeinfo,
              detail::exception::~exception);
}

Assistant:

void erase(const size_type idx)
    {
        // this erase only works for arrays
        if (JSON_HEDLEY_LIKELY(is_array()))
        {
            if (JSON_HEDLEY_UNLIKELY(idx >= size()))
            {
                JSON_THROW(out_of_range::create(401, "array index " + std::to_string(idx) + " is out of range"));
            }

            m_value.array->erase(m_value.array->begin() + static_cast<difference_type>(idx));
        }
        else
        {
            JSON_THROW(type_error::create(307, "cannot use erase() with " + std::string(type_name())));
        }
    }